

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O2

void __thiscall Preprocessor::substituteUntilNewline(Preprocessor *this,Symbols *substituted)

{
  long lVar1;
  bool bVar2;
  bool bVar3;
  Token TVar4;
  long in_FS_OFFSET;
  SubArray local_90;
  Symbol definedOrNotDefined;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
LAB_001326dc:
  do {
    if ((this->super_Parser).symbols.d.size <= (this->super_Parser).index) {
LAB_0013281b:
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    TVar4 = Parser::next(&this->super_Parser);
    if (TVar4 != IDENTIFIER) {
      if (TVar4 == PP_DEFINED) {
        bVar2 = Parser::test(&this->super_Parser,LPAREN);
        Parser::next(&this->super_Parser,IDENTIFIER);
        definedOrNotDefined.from = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        definedOrNotDefined.len = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        definedOrNotDefined.lex.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
        definedOrNotDefined.lex.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        definedOrNotDefined._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        definedOrNotDefined.lex.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        Symbol::Symbol(&definedOrNotDefined,
                       (this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
        Symbol::operator_cast_to_SubArray(&local_90,&definedOrNotDefined);
        bVar3 = QHash<SubArray,_Macro>::contains(&this->macros,&local_90);
        definedOrNotDefined.token = PP_MOC_FALSE - bVar3;
        QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_90);
        QList<Symbol>::emplaceBack<Symbol_const&>(substituted,&definedOrNotDefined);
        if (bVar2) {
          Parser::test(&this->super_Parser,PP_RPAREN);
        }
        QArrayDataPointer<char>::~QArrayDataPointer(&definedOrNotDefined.lex.d);
      }
      else {
        if (TVar4 == NEWLINE) {
          QList<Symbol>::emplaceBack<Symbol_const&>
                    (substituted,
                     (this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1);
          goto LAB_0013281b;
        }
        QList<Symbol>::emplaceBack<Symbol_const&>
                  (substituted,(this->super_Parser).symbols.d.ptr + (this->super_Parser).index + -1)
        ;
      }
      goto LAB_001326dc;
    }
    definedOrNotDefined.lineNum = 0;
    definedOrNotDefined.token = NOTOKEN;
    macroExpand(substituted,this,(Symbols *)this,&(this->super_Parser).index,
                (this->super_Parser).symbols.d.ptr[(this->super_Parser).index + -1].lineNum,true,
                (QSet<QByteArray> *)&definedOrNotDefined);
    QHash<QByteArray,_QHashDummyValue>::~QHash
              ((QHash<QByteArray,_QHashDummyValue> *)&definedOrNotDefined);
  } while( true );
}

Assistant:

void Preprocessor::substituteUntilNewline(Symbols &substituted)
{
    while (hasNext()) {
        Token token = next();
        if (token == PP_IDENTIFIER) {
            macroExpand(&substituted, this, symbols, index, symbol().lineNum, true);
        } else if (token == PP_DEFINED) {
            bool braces = test(PP_LPAREN);
            next(PP_IDENTIFIER);
            Symbol definedOrNotDefined = symbol();
            definedOrNotDefined.token = macros.contains(definedOrNotDefined)? PP_MOC_TRUE : PP_MOC_FALSE;
            substituted += definedOrNotDefined;
            if (braces)
                test(PP_RPAREN);
            continue;
        } else if (token == PP_NEWLINE) {
            substituted += symbol();
            break;
        } else {
            substituted += symbol();
        }
    }
}